

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

bool llvm::sys::path::remove_dots(SmallVectorImpl<char> *path,bool remove_dot_dot,Style style)

{
  char *pcVar1;
  StringRef path_00;
  undefined8 uVar2;
  undefined4 uVar3;
  SmallVectorImpl<char> *this;
  int iVar4;
  ulong uVar5;
  Style in_R8D;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  path *this_00;
  bool bVar9;
  StringRef SVar10;
  StringRef path_01;
  StringRef C;
  StringRef C_1;
  SmallString<256U> result;
  SmallVector<llvm::StringRef,_16U> components;
  StringRef local_2e8;
  SmallVectorImpl<char> *local_2d8;
  undefined1 *local_2d0;
  Child local_2c8;
  size_t sStack_2c0;
  StringRef local_2a8;
  Twine local_298;
  const_iterator local_280 [5];
  Twine local_170;
  Twine local_158;
  SmallVectorTemplateBase<llvm::StringRef,_true> local_140;
  undefined1 local_130 [256];
  
  pcVar1 = (char *)(path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar2 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar3 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  SVar10.Length._0_4_ = uVar3;
  SVar10.Data = (char *)uVar2;
  uVar6 = (ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       local_130;
  local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity =
       0x10;
  SVar10.Length._4_4_ = 0;
  local_2e8.Data = pcVar1;
  local_2e8.Length = uVar6;
  local_2d8 = path;
  SVar10 = root_path(SVar10,style);
  uVar5 = SVar10.Length;
  if (uVar6 <= SVar10.Length) {
    uVar5 = uVar6;
  }
  this_00 = (path *)(pcVar1 + uVar5);
  sVar7 = uVar6 - uVar5;
  path_01.Length._0_4_ = style;
  path_01.Data = (char *)sVar7;
  path_01.Length._4_4_ = 0;
  begin(local_280,this_00,path_01,in_R8D);
  if (((path *)local_280[0].Path.Data != this_00) || (local_280[0].Position != sVar7)) {
    do {
      local_2c8.cString = local_280[0].Component.Data;
      sStack_2c0 = local_280[0].Component.Length;
      if ((local_280[0].Component.Length != 1) || (*local_280[0].Component.Data != '.')) {
        if ((local_280[0].Component.Length == 2 && remove_dot_dot) &&
           (*(short *)local_280[0].Component.Data == 0x2e2e)) {
          uVar5 = local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                  super_SmallVectorBase._8_8_ & 0xffffffff;
          if ((uVar5 == 0) ||
             ((*(long *)((long)local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                               super_SmallVectorBase.BeginX + uVar5 * 0x10 + -8) == 2 &&
              (**(short **)
                 ((long)local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                        super_SmallVectorBase.BeginX + uVar5 * 0x10 + -0x10) == 0x2e2e)))) {
            Twine::Twine(&local_298,&local_2e8);
            bVar9 = is_absolute(&local_298,style);
            if (!bVar9) goto LAB_00150f48;
          }
          else {
            if ((ulong)local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                       super_SmallVectorBase.Capacity < uVar5 - 1) {
              __assert_fail("Size <= capacity()",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                            ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
            }
            local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
            Size = (int)(uVar5 - 1);
          }
        }
        else {
LAB_00150f48:
          SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                    (&local_140,(StringRef *)&local_2c8);
        }
      }
      const_iterator::operator++(local_280);
    } while (((path *)local_280[0].Path.Data != this_00) || (local_280[0].Position != sVar7));
  }
  path_00.Length = local_2e8.Length;
  path_00.Data = local_2e8.Data;
  SVar10 = root_path(path_00,style);
  local_280[0].Path.Data = (char *)&local_280[0].Component;
  local_280[0].Path.Length = 0x10000000000;
  SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)local_280,SVar10.Data,SVar10.Data + SVar10.Length);
  uVar5 = local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
          _8_8_ & 0xffffffff;
  if (uVar5 != 0) {
    local_2d0 = (undefined1 *)
                local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                super_SmallVectorBase.BeginX;
    lVar8 = 0;
    do {
      local_2a8.Data = *(char **)(local_2d0 + lVar8);
      local_2a8.Length = *(size_t *)((long)(local_2d0 + lVar8) + 8);
      Twine::Twine(&local_298,&local_2a8);
      Twine::Twine((Twine *)&local_2c8,"");
      Twine::Twine(&local_158,"");
      Twine::Twine(&local_170,"");
      append((SmallVectorImpl<char> *)local_280,style,&local_298,(Twine *)&local_2c8,&local_158,
             &local_170);
      lVar8 = lVar8 + 0x10;
    } while (uVar5 << 4 != lVar8);
  }
  if ((undefined1 *)
      local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX
      != local_130) {
    free(local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
         BeginX);
  }
  this = local_2d8;
  if ((uint)local_280[0].Path.Length ==
      (local_2d8->super_SmallVectorTemplateBase<char,_true>).
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) {
    if ((local_280[0].Path.Length & 0xffffffff) == 0) {
      bVar9 = true;
    }
    else {
      iVar4 = bcmp(local_280[0].Path.Data,
                   (local_2d8->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                   local_280[0].Path.Length & 0xffffffff);
      bVar9 = iVar4 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  if (bVar9 == false) {
    SmallVectorImpl<char>::swap(this,(SmallVectorImpl<char> *)local_280);
  }
  if ((StringRef *)local_280[0].Path.Data != &local_280[0].Component) {
    free(local_280[0].Path.Data);
  }
  return (bool)(bVar9 ^ 1);
}

Assistant:

bool remove_dots(SmallVectorImpl<char> &path, bool remove_dot_dot,
                 Style style) {
  StringRef p(path.data(), path.size());

  SmallString<256> result = remove_dots(p, remove_dot_dot, style);
  if (result == path)
    return false;

  path.swap(result);
  return true;
}